

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O3

void __thiscall
Minisat::Clause::Clause(Clause *this,vec<Minisat::Lit,_int> *ps,bool use_extra,bool learnt)

{
  uint uVar1;
  anon_struct_4_5_613047fb_for_header aVar2;
  Lit *pLVar3;
  int iVar4;
  int iVar5;
  Clause CVar6;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  ulong uVar7;
  long lVar8;
  
  iVar4 = (int)CONCAT71(in_register_00000011,use_extra);
  iVar5 = (int)CONCAT71(in_register_00000009,learnt);
  this->header = (anon_struct_4_5_613047fb_for_header)
                 (((uint)this->header & 0xffffffe0) + iVar4 * 8 + iVar5 * 4);
  uVar1 = ps->sz;
  this->header = (anon_struct_4_5_613047fb_for_header)(uVar1 * 0x20 + iVar4 * 8 + iVar5 * 4);
  if (0 < ps->sz) {
    pLVar3 = ps->data;
    lVar8 = 0;
    do {
      this[lVar8 + 1].header = *(anon_struct_4_5_613047fb_for_header *)(pLVar3 + lVar8);
      lVar8 = lVar8 + 1;
    } while (lVar8 < ps->sz);
  }
  if (use_extra) {
    if (!learnt) {
      aVar2 = this->header;
      if (((uint)aVar2 & 8) != 0) {
        if ((uint)aVar2 < 0x20) {
          CVar6.header = (anon_struct_4_5_613047fb_for_header)0x0;
        }
        else {
          uVar7 = 0;
          CVar6.header = (anon_struct_4_5_613047fb_for_header)0x0;
          do {
            CVar6.header = CVar6.header | 1 << (*(byte *)&this[uVar7 + 1].header >> 1 & 0x1f);
            uVar7 = uVar7 + 1;
          } while ((uint)aVar2 >> 5 != uVar7);
        }
        this[(ulong)((uint)aVar2 >> 5) + 1].header = CVar6.header;
        return;
      }
      __assert_fail("header.has_extra",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/core/SolverTypes.h"
                    ,0xbc,"void Minisat::Clause::calcAbstraction()");
    }
    this[(ulong)(uVar1 & 0x7ffffff) + 1].header = (anon_struct_4_5_613047fb_for_header)0x0;
  }
  return;
}

Assistant:

Clause(const vec<Lit>& ps, bool use_extra, bool learnt) {
        header.mark      = 0;
        header.learnt    = learnt;
        header.has_extra = use_extra;
        header.reloced   = 0;
        header.size      = ps.size();

        for (int i = 0; i < ps.size(); i++) 
            data[i].lit = ps[i];

        if (header.has_extra){
            if (header.learnt)
                data[header.size].act = 0;
            else
                calcAbstraction();
    }
    }